

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Array<unsigned_char> * __thiscall
kj::anon_unknown_36::WebSocketImpl::serializeClose
          (Array<unsigned_char> *__return_storage_ptr__,WebSocketImpl *this,uint16_t code,
          StringPtr reason)

{
  ushort *puVar1;
  Array<unsigned_char> *pAVar2;
  char *pcVar3;
  undefined6 in_register_00000012;
  char *elementCount;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  
  pcVar3 = reason.content.ptr;
  if ((int)this == 0x3ed) {
    _kjCondition.left = (unsigned_long)(pcVar3 + -1);
    _kjCondition.result = (char *)_kjCondition.left == (char *)0x0;
    _kjCondition.right = 0;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[47]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xe14,FAILED,"reason.size() == 0",
                 "_kjCondition,\"WebSocket close code 1005 cannot have a reason\"",&_kjCondition,
                 (char (*) [47])"WebSocket close code 1005 cannot have a reason");
      kj::_::Debug::Fault::fatal(&f);
    }
    pAVar2 = (Array<unsigned_char> *)0x0;
    elementCount = (char *)0x0;
    puVar1 = (ushort *)0x0;
  }
  else {
    elementCount = pcVar3 + 1;
    puVar1 = (ushort *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (1,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    *puVar1 = (ushort)this << 8 | (ushort)this >> 8;
    memcpy(puVar1 + 1,(void *)CONCAT62(in_register_00000012,code),(size_t)(pcVar3 + -1));
    pAVar2 = (Array<unsigned_char> *)&kj::_::HeapArrayDisposer::instance;
  }
  __return_storage_ptr__->ptr = (uchar *)puVar1;
  __return_storage_ptr__->size_ = (size_t)elementCount;
  __return_storage_ptr__->disposer = (ArrayDisposer *)pAVar2;
  return pAVar2;
}

Assistant:

kj::Array<byte> serializeClose(uint16_t code, kj::StringPtr reason) {
    kj::Array<byte> payload;
    if (code == 1005) {
      KJ_REQUIRE(reason.size() == 0, "WebSocket close code 1005 cannot have a reason");

      // code 1005 -- leave payload empty
    } else {
      payload = heapArray<byte>(reason.size() + 2);
      payload[0] = code >> 8;
      payload[1] = code;
      memcpy(payload.begin() + 2, reason.begin(), reason.size());
    }
    return kj::mv(payload);
  }